

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O1

void UpdateHistogramCost(VP8LHistogram *h)

{
  int length;
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  uint32_t blue_sym;
  uint32_t red_sym;
  uint32_t alpha_sym;
  uint local_34;
  uint local_30;
  uint local_2c;
  
  dVar2 = PopulationCost(h->alpha_,0x100,&local_2c,h->is_used_ + 3);
  dVar3 = PopulationCost(h->distance_,0x28,(uint32_t *)0x0,h->is_used_ + 4);
  dVar4 = (*VP8LExtraCost)(h->distance_,0x28);
  length = (1 << ((byte)h->palette_code_bits_ & 0x1f)) + 0x118;
  if (h->palette_code_bits_ < 1) {
    length = 0x118;
  }
  dVar5 = PopulationCost(h->literal_,length,(uint32_t *)0x0,h->is_used_);
  dVar6 = (*VP8LExtraCost)(h->literal_ + 0x100,0x18);
  h->literal_cost_ = dVar6 + dVar5;
  dVar5 = PopulationCost(h->red_,0x100,&local_30,h->is_used_ + 1);
  h->red_cost_ = dVar5;
  dVar5 = PopulationCost(h->blue_,0x100,&local_34,h->is_used_ + 2);
  h->blue_cost_ = dVar5;
  h->bit_cost_ = h->literal_cost_ + h->red_cost_ + dVar5 + dVar2 + dVar4 + dVar3;
  uVar1 = local_30 << 0x10 | local_2c << 0x18 | local_34;
  if ((local_30 | local_2c | local_34) == 0xffffffff) {
    uVar1 = 0xffffffff;
  }
  h->trivial_symbol_ = uVar1;
  return;
}

Assistant:

static void UpdateHistogramCost(VP8LHistogram* const h) {
  uint32_t alpha_sym, red_sym, blue_sym;
  const double alpha_cost =
      PopulationCost(h->alpha_, NUM_LITERAL_CODES, &alpha_sym,
                     &h->is_used_[3]);
  const double distance_cost =
      PopulationCost(h->distance_, NUM_DISTANCE_CODES, NULL, &h->is_used_[4]) +
      VP8LExtraCost(h->distance_, NUM_DISTANCE_CODES);
  const int num_codes = VP8LHistogramNumCodes(h->palette_code_bits_);
  h->literal_cost_ =
      PopulationCost(h->literal_, num_codes, NULL, &h->is_used_[0]) +
          VP8LExtraCost(h->literal_ + NUM_LITERAL_CODES, NUM_LENGTH_CODES);
  h->red_cost_ =
      PopulationCost(h->red_, NUM_LITERAL_CODES, &red_sym, &h->is_used_[1]);
  h->blue_cost_ =
      PopulationCost(h->blue_, NUM_LITERAL_CODES, &blue_sym, &h->is_used_[2]);
  h->bit_cost_ = h->literal_cost_ + h->red_cost_ + h->blue_cost_ +
                 alpha_cost + distance_cost;
  if ((alpha_sym | red_sym | blue_sym) == VP8L_NON_TRIVIAL_SYM) {
    h->trivial_symbol_ = VP8L_NON_TRIVIAL_SYM;
  } else {
    h->trivial_symbol_ =
        ((uint32_t)alpha_sym << 24) | (red_sym << 16) | (blue_sym << 0);
  }
}